

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::push_front
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *v)

{
  int iVar1;
  int iVar2;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar3;
  undefined4 uVar4;
  ImGuiStoragePair *pIVar5;
  uint uVar6;
  uint uVar7;
  
  iVar1 = this->Size;
  if (iVar1 == 0) {
    if (this->Capacity == 0) {
      pIVar5 = (ImGuiStoragePair *)ImGui::MemAlloc(0x80);
      if (this->Data != (ImGuiStoragePair *)0x0) {
        memcpy(pIVar5,this->Data,(long)this->Size << 4);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar5;
      this->Capacity = 8;
    }
    pIVar5 = this->Data + this->Size;
  }
  else {
    if (iVar1 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                    ,0x4f2,
                    "T *ImVector<ImGuiStorage::ImGuiStoragePair>::insert(const T *, const T &) [T = ImGuiStorage::ImGuiStoragePair]"
                   );
    }
    iVar2 = this->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        uVar6 = 8;
      }
      else {
        uVar6 = iVar2 / 2 + iVar2;
      }
      uVar7 = iVar1 + 1U;
      if ((int)(iVar1 + 1U) < (int)uVar6) {
        uVar7 = uVar6;
      }
      if (iVar2 < (int)uVar7) {
        pIVar5 = (ImGuiStoragePair *)ImGui::MemAlloc((ulong)uVar7 << 4);
        if (this->Data != (ImGuiStoragePair *)0x0) {
          memcpy(pIVar5,this->Data,(long)this->Size << 4);
          ImGui::MemFree(this->Data);
        }
        this->Data = pIVar5;
        this->Capacity = uVar7;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size << 4);
    }
    pIVar5 = this->Data;
  }
  uVar4 = *(undefined4 *)&v->field_0x4;
  aVar3 = v->field_1;
  pIVar5->key = v->key;
  *(undefined4 *)&pIVar5->field_0x4 = uVar4;
  pIVar5->field_1 = aVar3;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }